

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O3

void __thiscall CorUnix::CSharedMemoryObject::~CSharedMemoryObject(CSharedMemoryObject *this)

{
  (this->super_CPalObjectBase).super_IPalObject._vptr_IPalObject =
       (_func_int **)&PTR_GetObjectType_014c2c50;
  if (PAL_InitializeChakraCoreCalled != false) {
    if (this->m_fSharedDataDereferenced == 0) {
      fprintf(_stderr,"] %s %s:%d","~CSharedMemoryObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
              ,0x363);
      fprintf(_stderr,
              "DereferenceSharedData not called before object destructor -- delete called directly?\n"
             );
      DereferenceSharedData(this);
    }
    if ((this->m_pvSharedData == (void *)0x0) || (this->m_ObjectDomain != ProcessLocalObject)) {
      if ((this->m_shmod != 0) && (this->m_fDeleteSharedData != 0)) {
        FreeSharedDataAreas(this->m_shmod);
      }
    }
    else {
      InternalFree(this->m_pvSharedData);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      CSimpleDataLock::~CSimpleDataLock(&this->m_sdlSharedData);
      CPalObjectBase::~CPalObjectBase(&this->super_CPalObjectBase);
      return;
    }
  }
  abort();
}

Assistant:

CSharedMemoryObject::~CSharedMemoryObject()
{
    ENTRY("CSharedMemoryObject::~CSharedMemoryObject(this = %p)\n", this);
    
    if (!m_fSharedDataDereferenced)
    {
        ASSERT("DereferenceSharedData not called before object destructor -- delete called directly?\n");
        DereferenceSharedData();
    }

    if (NULL != m_pvSharedData && ProcessLocalObject == m_ObjectDomain)
    {
        InternalFree(m_pvSharedData);
    }
    else if (SHMNULL != m_shmod && m_fDeleteSharedData)
    {
        FreeSharedDataAreas(m_shmod);        
    }

    LOGEXIT("CSharedMemoryObject::~CSharedMemoryObject\n");
}